

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O3

void __thiscall
Imf_3_2::PizCompressor::PizCompressor
          (PizCompressor *this,Header *hdr,size_t maxScanLineSize,size_t numScanLines)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ChannelList *pCVar4;
  unsigned_short *puVar5;
  char *pcVar6;
  const_iterator cVar7;
  ConstIterator CVar8;
  ChannelData *pCVar9;
  Box2i *pBVar10;
  OverflowExc *pOVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  
  Compressor::Compressor(&this->super_Compressor,hdr);
  (this->super_Compressor)._vptr_Compressor = (_func_int **)&PTR__PizCompressor_003d6ec0;
  this->_maxScanLineSize = (int)maxScanLineSize;
  this->_format = XDR;
  this->_numScanLines = (int)numScanLines;
  this->_tmpBuffer = (unsigned_short *)0x0;
  this->_outBuffer = (char *)0x0;
  this->_numChans = 0;
  pCVar4 = Header::channels(hdr);
  this->_channels = pCVar4;
  this->_channelData = (ChannelData *)0x0;
  if (maxScanLineSize == 0) {
    uVar14 = 0;
    uVar13 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = maxScanLineSize;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = numScanLines;
    if (SUB168(auVar1 * auVar2,8) != 0) {
      pOVar11 = (OverflowExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::OverflowExc::OverflowExc(pOVar11,"Integer multiplication overflow.");
      __cxa_throw(pOVar11,&Iex_3_2::OverflowExc::typeinfo,Iex_3_2::OverflowExc::~OverflowExc);
    }
    uVar14 = numScanLines * maxScanLineSize;
    if (0xfffffffffffedfff < uVar14) {
      pOVar11 = (OverflowExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::OverflowExc::OverflowExc(pOVar11,"Integer addition overflow.");
      __cxa_throw(pOVar11,&Iex_3_2::OverflowExc::typeinfo,Iex_3_2::OverflowExc::~OverflowExc);
    }
    uVar13 = uVar14 & 0xfffffffffffffffe;
  }
  puVar5 = (unsigned_short *)operator_new__(uVar13);
  this->_tmpBuffer = puVar5;
  pcVar6 = (char *)operator_new__(uVar14 + 0x12000);
  this->_outBuffer = pcVar6;
  pCVar4 = Header::channels((this->super_Compressor)._header);
  cVar7._M_node = (_Base_ptr)ChannelList::begin(pCVar4);
  bVar12 = true;
  while( true ) {
    CVar8 = ChannelList::end(pCVar4);
    iVar3 = this->_numChans;
    if ((const_iterator)cVar7._M_node == CVar8._i._M_node) break;
    this->_numChans = iVar3 + 1;
    bVar12 = (bool)(bVar12 & cVar7._M_node[9]._M_color == _S_black);
    cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
  }
  uVar13 = 0xffffffffffffffff;
  if (-1 < iVar3) {
    uVar13 = (long)iVar3 << 5;
  }
  pCVar9 = (ChannelData *)operator_new__(uVar13);
  this->_channelData = pCVar9;
  pBVar10 = Header::dataWindow(hdr);
  this->_minX = (pBVar10->min).x;
  iVar3 = (pBVar10->max).y;
  this->_maxX = (pBVar10->max).x;
  this->_maxY = iVar3;
  if (bVar12) {
    iVar3 = pixelTypeSize(HALF);
    if (iVar3 == 2) {
      this->_format = NATIVE;
    }
  }
  return;
}

Assistant:

PizCompressor::PizCompressor (
    const Header& hdr, size_t maxScanLineSize, size_t numScanLines)
    : Compressor (hdr)
    , _maxScanLineSize (maxScanLineSize)
    , _format (XDR)
    , _numScanLines (numScanLines)
    , _tmpBuffer (0)
    , _outBuffer (0)
    , _numChans (0)
    , _channels (hdr.channels ())
    , _channelData (0)
{
    // TODO: Remove this when we can change the ABI
    (void) _maxScanLineSize;
    size_t tmpBufferSize = uiMult (maxScanLineSize, numScanLines) / 2;

    size_t outBufferSize =
        uiAdd (uiMult (maxScanLineSize, numScanLines), size_t (65536 + 8192));

    _tmpBuffer = new unsigned short[checkArraySize (
        tmpBufferSize, sizeof (unsigned short))];

    _outBuffer = new char[outBufferSize];

    const ChannelList& channels         = header ().channels ();
    bool               onlyHalfChannels = true;

    for (ChannelList::ConstIterator c = channels.begin (); c != channels.end ();
         ++c)
    {
        _numChans++;

        assert (pixelTypeSize (c.channel ().type) % pixelTypeSize (HALF) == 0);

        if (c.channel ().type != HALF) onlyHalfChannels = false;
    }

    _channelData = new ChannelData[_numChans];

    const Box2i& dataWindow = hdr.dataWindow ();

    _minX = dataWindow.min.x;
    _maxX = dataWindow.max.x;
    _maxY = dataWindow.max.y;

    //
    // We can support uncompressed data in the machine's native format
    // if all image channels are of type HALF, and if the Xdr and the
    // native representations of a half have the same size.
    //

    if (onlyHalfChannels && (sizeof (half) == pixelTypeSize (HALF)))
        _format = NATIVE;
}